

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O0

void __thiscall Assimp::glTF2Exporter::ExportAnimations(glTF2Exporter *this)

{
  aiAnimation *this_00;
  element_type *peVar1;
  char *pcVar2;
  Ref<glTF2::Buffer> RVar3;
  Ref<glTF2::Animation> RVar4;
  Ref<glTF2::Node> RVar5;
  undefined1 local_1c0 [8];
  Sampler scaleSampler;
  Sampler rotationSampler;
  Sampler translationSampler;
  undefined1 local_138 [8];
  Ref<glTF2::Node> animNode;
  undefined1 local_118 [8];
  Ref<glTF2::Animation> animRef;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  string name;
  aiNodeAnim *nodeChannel;
  uint channelIndex;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string nameAnim;
  float ticksPerSecond;
  aiAnimation *anim;
  uint i;
  undefined1 local_20 [8];
  Ref<glTF2::Buffer> bufferRef;
  glTF2Exporter *this_local;
  
  bufferRef._8_8_ = this;
  peVar1 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->mAsset);
  RVar3 = glTF2::LazyDict<glTF2::Buffer>::Get(&peVar1->buffers,0);
  local_20 = (undefined1  [8])RVar3.vector;
  bufferRef.vector._0_4_ = RVar3.index;
  for (anim._4_4_ = 0; anim._4_4_ < this->mScene->mNumAnimations; anim._4_4_ = anim._4_4_ + 1) {
    this_00 = this->mScene->mAnimations[anim._4_4_];
    nameAnim.field_2._12_4_ = (undefined4)this_00->mTicksPerSecond;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"anim",&local_69);
    std::allocator<char>::~allocator(&local_69);
    if ((this_00->mName).length != 0) {
      pcVar2 = aiString::C_Str(&this_00->mName);
      std::__cxx11::string::operator=((string *)local_68,pcVar2);
    }
    for (nodeChannel._0_4_ = 0; (uint)nodeChannel < this_00->mNumChannels;
        nodeChannel._0_4_ = (uint)nodeChannel + 1) {
      name.field_2._8_8_ = this_00->mChannels[(uint)nodeChannel];
      std::operator+(&local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     "_");
      to_string<unsigned_int>(&local_e8,(uint)nodeChannel);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                     &local_c8,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_c8);
      peVar1 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mAsset);
      glTF2::Asset::FindUniqueID((string *)&animRef.index,peVar1,(string *)local_a8,"animation");
      std::__cxx11::string::operator=((string *)local_a8,(string *)&animRef.index);
      std::__cxx11::string::~string((string *)&animRef.index);
      peVar1 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mAsset);
      RVar4 = glTF2::LazyDict<glTF2::Animation>::Create(&peVar1->animations,(string *)local_a8);
      animNode._8_8_ = RVar4.vector;
      animRef.vector._0_4_ = RVar4.index;
      local_118 = (undefined1  [8])animNode._8_8_;
      peVar1 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mAsset);
      pcVar2 = aiString::C_Str((aiString *)name.field_2._8_8_);
      RVar5 = glTF2::LazyDict<glTF2::Node>::Get(&peVar1->nodes,pcVar2);
      local_138 = (undefined1  [8])RVar5.vector;
      animNode.vector._0_4_ = RVar5.index;
      glTF2::Animation::Sampler::Sampler((Sampler *)&rotationSampler.interpolation);
      peVar1 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mAsset);
      ExtractTranslationSampler
                (peVar1,(string *)local_a8,(Ref<glTF2::Buffer> *)local_20,
                 (aiNodeAnim *)name.field_2._8_8_,(float)nameAnim.field_2._12_4_,
                 (Sampler *)&rotationSampler.interpolation);
      AddSampler((Ref<glTF2::Animation> *)local_118,(Ref<glTF2::Node> *)local_138,
                 (Sampler *)&rotationSampler.interpolation,AnimationPath_TRANSLATION);
      glTF2::Animation::Sampler::Sampler((Sampler *)&scaleSampler.interpolation);
      peVar1 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mAsset);
      ExtractRotationSampler
                (peVar1,(string *)local_a8,(Ref<glTF2::Buffer> *)local_20,
                 (aiNodeAnim *)name.field_2._8_8_,(float)nameAnim.field_2._12_4_,
                 (Sampler *)&scaleSampler.interpolation);
      AddSampler((Ref<glTF2::Animation> *)local_118,(Ref<glTF2::Node> *)local_138,
                 (Sampler *)&scaleSampler.interpolation,AnimationPath_ROTATION);
      glTF2::Animation::Sampler::Sampler((Sampler *)local_1c0);
      peVar1 = std::__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mAsset);
      ExtractScaleSampler(peVar1,(string *)local_a8,(Ref<glTF2::Buffer> *)local_20,
                          (aiNodeAnim *)name.field_2._8_8_,(float)nameAnim.field_2._12_4_,
                          (Sampler *)local_1c0);
      AddSampler((Ref<glTF2::Animation> *)local_118,(Ref<glTF2::Node> *)local_138,
                 (Sampler *)local_1c0,AnimationPath_SCALE);
      std::__cxx11::string::~string((string *)local_a8);
    }
    std::__cxx11::string::~string((string *)local_68);
  }
  return;
}

Assistant:

void glTF2Exporter::ExportAnimations()
{
    Ref<Buffer> bufferRef = mAsset->buffers.Get(unsigned (0));

    for (unsigned int i = 0; i < mScene->mNumAnimations; ++i) {
        const aiAnimation* anim = mScene->mAnimations[i];
        const float ticksPerSecond = static_cast<float>(anim->mTicksPerSecond);

        std::string nameAnim = "anim";
        if (anim->mName.length > 0) {
            nameAnim = anim->mName.C_Str();
        }

        for (unsigned int channelIndex = 0; channelIndex < anim->mNumChannels; ++channelIndex) {
            const aiNodeAnim* nodeChannel = anim->mChannels[channelIndex];

            // It appears that assimp stores this type of animation as multiple animations.
            // where each aiNodeAnim in mChannels animates a specific node.
            std::string name = nameAnim + "_" + to_string(channelIndex);
            name = mAsset->FindUniqueID(name, "animation");
            Ref<Animation> animRef = mAsset->animations.Create(name);

            Ref<Node> animNode = mAsset->nodes.Get(nodeChannel->mNodeName.C_Str());

            Animation::Sampler translationSampler;
            ExtractTranslationSampler(*mAsset, name, bufferRef, nodeChannel, ticksPerSecond, translationSampler);
            AddSampler(animRef, animNode, translationSampler, AnimationPath_TRANSLATION);

            Animation::Sampler rotationSampler;
            ExtractRotationSampler(*mAsset, name, bufferRef, nodeChannel, ticksPerSecond, rotationSampler);
            AddSampler(animRef, animNode, rotationSampler, AnimationPath_ROTATION);

            Animation::Sampler scaleSampler;
            ExtractScaleSampler(*mAsset, name, bufferRef, nodeChannel, ticksPerSecond, scaleSampler);
            AddSampler(animRef, animNode, scaleSampler, AnimationPath_SCALE);
        }

        // Assimp documentation staes this is not used (not implemented)
        // for (unsigned int channelIndex = 0; channelIndex < anim->mNumMeshChannels; ++channelIndex) {
        //     const aiMeshAnim* meshChannel = anim->mMeshChannels[channelIndex];
        // }

    } // End: for-loop mNumAnimations
}